

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O3

void __thiscall
Fifteen::moveNumericTile(Fifteen *this,size_t rowSrc,size_t colSrc,size_t rowDst,size_t colDst)

{
  pointer puVar1;
  __uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_> _Var2;
  int *piVar3;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *pvVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  QByteArrayView QVar9;
  key_type local_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined8 local_68;
  Controller local_58;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pvVar4 = TilesBoard::getTiles
                     ((this->tilesBoard)._M_t.
                      super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                      super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                      super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  Controller::getBoardAttributes(&local_58);
  uVar5 = (long)local_58.imageProvider._M_t.
                super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
                super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
                super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl * rowDst + colDst;
  puVar1 = (pvVar4->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(pvVar4->
                super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  uVar8 = uVar5;
  if ((uVar5 < uVar7) &&
     (uVar8 = (long)local_58.imageProvider._M_t.
                    super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
                    super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
                    super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl * rowSrc + colSrc,
     uVar8 < uVar7)) {
    _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
    super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
         puVar1[uVar5]._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
         _M_t;
    QAbstractButton::text();
    QAbstractButton::setText
              ((QString *)
               _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
               super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
    piVar3 = (int *)CONCAT44(uStack_74,local_78);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,8);
      }
    }
    uVar8 = rowDst * (long)local_58.imageProvider._M_t.
                           super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>
                           .super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl + colDst;
    puVar1 = (pvVar4->
             super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar8 < (ulong)((long)(pvVar4->
                              super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
      _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
      super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
           puVar1[uVar8]._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
           _M_t;
      Options::getTileColor();
      QWidget::setStyleSheet
                ((QString *)
                 _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>
                 .super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
      uVar8 = (long)local_58.imageProvider._M_t.
                    super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
                    super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
                    super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl * rowSrc + colSrc;
      puVar1 = (pvVar4->
               super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (uVar8 < (ulong)((long)(pvVar4->
                                super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
        _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
             puVar1[uVar8]._M_t.
             super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t;
        QVar9.m_data = (storage_type *)0x0;
        QVar9.m_size = (qsizetype)&local_78;
        QString::fromUtf8(QVar9);
        local_58.undoMoveService._M_t.
        super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
        super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
        super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl._4_4_ = uStack_74;
        local_58.undoMoveService._M_t.
        super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
        super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
        super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl._0_4_ = local_78;
        uStack_40 = uStack_70;
        local_38 = local_68;
        QAbstractButton::setText
                  ((QString *)
                   _Var2._M_t.
                   super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                   super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
        if ((_Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>)
            local_58.undoMoveService._M_t.
            super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
            super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
            super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl != (UndoMove *)0x0) {
          LOCK();
          *(int *)local_58.undoMoveService._M_t.
                  super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                  super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                  super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl =
               *(int *)local_58.undoMoveService._M_t.
                       super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                       super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                       super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl + -1;
          UNLOCK();
          if (*(int *)local_58.undoMoveService._M_t.
                      super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                      super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                      super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl == 0) {
            QArrayData::deallocate
                      ((QArrayData *)
                       local_58.undoMoveService._M_t.
                       super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>._M_t.
                       super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
                       super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl,2,8);
          }
        }
        uVar8 = rowSrc * (long)local_58.imageProvider._M_t.
                               super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>
                               .super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl + colSrc;
        puVar1 = (pvVar4->
                 super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (uVar8 < (ulong)((long)(pvVar4->
                                  super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3))
        {
          _Var2._M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
          super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
               puVar1[uVar8]._M_t.
               super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t;
          local_78 = EMPTY;
          std::
          map<TileColor,_const_QString,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_const_QString>_>_>
          ::at(&Maps::tileColorStyle,&local_78);
          QWidget::setStyleSheet
                    ((QString *)
                     _Var2._M_t.
                     super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                     super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
          return;
        }
      }
    }
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8);
  if (local_58.undoMoveService._M_t.super___uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>.
      _M_t.super__Tuple_impl<0UL,_UndoMove_*,_std::default_delete<UndoMove>_>.
      super__Head_base<0UL,_UndoMove_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<UndoMove,_std::default_delete<UndoMove>_>)0x0) {
    moveNumericTile();
  }
  _Unwind_Resume(uVar6);
}

Assistant:

void Fifteen::moveNumericTile( size_t rowSrc, size_t colSrc, size_t rowDst, size_t colDst )
{
    auto& tiles = tilesBoard->getTiles();
    const auto [ boardSize, _ ] = controller->getBoardAttributes();

    tiles.at( rowDst * boardSize + colDst )->setText( tiles.at( rowSrc * boardSize + colSrc )->text() );
    tiles.at( rowDst * boardSize + colDst )->setStyleSheet( Options::getTileColor() );
    tiles.at( rowSrc * boardSize + colSrc )->setText( "" );
    tiles.at( rowSrc * boardSize + colSrc )->setStyleSheet( Maps::tileColorStyle.at( TileColor::EMPTY ));
}